

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

bool NULLC::IsBasePointer(void *ptr)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong *puVar4;
  void *block;
  int iVar5;
  
  for (lVar2 = pool16._24_8_; iVar5 = (int)ptr, lVar3 = pool32._40_8_, lVar2 != 0;
      lVar2 = *(long *)(lVar2 + 0x10008)) {
    if ((ptr <= (long *)(lVar2 + 0x10008) && (void *)(lVar2 + 8U) <= ptr) &&
       ((iVar5 - (int)(void *)(lVar2 + 8U) & 0xfU) == 8)) {
      return true;
    }
  }
  for (; lVar2 = pool64._72_8_, lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x10008)) {
    if ((ptr <= (long *)(lVar3 + 0x10008) && (void *)(lVar3 + 8U) <= ptr) &&
       ((iVar5 - (int)(void *)(lVar3 + 8U) & 0x1fU) == 8)) {
      return true;
    }
  }
  for (; lVar3 = pool128._136_8_, lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x10008)) {
    if ((ptr <= (long *)(lVar2 + 0x10008) && (void *)(lVar2 + 8U) <= ptr) &&
       ((iVar5 - (int)(void *)(lVar2 + 8U) & 0x3fU) == 8)) {
      return true;
    }
  }
  for (; lVar2 = pool256._264_8_, lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x10008)) {
    if ((ptr <= (long *)(lVar3 + 0x10008) && (void *)(lVar3 + 8U) <= ptr) &&
       ((iVar5 - (int)(void *)(lVar3 + 8U) & 0x7fU) == 8)) {
      return true;
    }
  }
  for (; lVar3 = pool512._520_8_, lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x10008)) {
    if ((ptr <= (long *)(lVar2 + 0x10008) && (void *)(lVar2 + 8U) <= ptr) &&
       ((char)((char)ptr - (char)(void *)(lVar2 + 8U)) == '\b')) {
      return true;
    }
  }
  for (; puVar4 = (ulong *)bigBlocks._24_8_, lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x10008)) {
    if ((ptr <= (long *)(lVar3 + 0x10008) && (void *)(lVar3 + 8U) <= ptr) &&
       ((iVar5 - (int)(void *)(lVar3 + 8U) & 0x1ffU) == 8)) {
      return true;
    }
  }
  while( true ) {
    if (puVar4 == (ulong *)0x0) {
      return false;
    }
    pvVar1 = (void *)*puVar4;
    if ((pvVar1 <= ptr) && (ptr <= (void *)puVar4[1])) break;
    puVar4 = (ulong *)puVar4[(ulong)(pvVar1 <= ptr) + 2];
  }
  if ((void *)((long)ptr - 0xcU) != pvVar1) {
    return false;
  }
  return true;
}

Assistant:

bool IsBasePointer(void* ptr)
	{
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			if((char*)ptr >= (char*)curr->page && (char*)ptr <= (char*)curr->page + sizeof(curr->page))
			{
				if(((unsigned int)(intptr_t)((char*)ptr - (char*)curr->page) & (elemSize - 1)) == sizeof(markerType))
					return true;
			}
			curr = curr->next;
		}
		return false;
	}